

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

char * OperationToString(Operation op)

{
  char *pcStack_10;
  Operation op_local;
  
  switch(op) {
  case kBoth:
    pcStack_10 = "Both";
    break;
  case kEncrypt:
    pcStack_10 = "Encrypt";
    break;
  case kDecrypt:
    pcStack_10 = "Decrypt";
    break;
  case kInvalidDecrypt:
    pcStack_10 = "InvalidDecrypt";
    break;
  default:
    abort();
  }
  return pcStack_10;
}

Assistant:

static const char *OperationToString(Operation op) {
  switch (op) {
    case Operation::kBoth:
      return "Both";
    case Operation::kEncrypt:
      return "Encrypt";
    case Operation::kDecrypt:
      return "Decrypt";
    case Operation::kInvalidDecrypt:
      return "InvalidDecrypt";
  }
  abort();
}